

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_received(AMQP_VALUE value,RECEIVED_HANDLE *received_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  RECEIVED_HANDLE pRVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE value_00;
  uint32_t list_item_count;
  uint32_t section_number;
  uint local_34;
  uint64_t local_30;
  
  pRVar4 = (RECEIVED_HANDLE)malloc(8);
  if (pRVar4 == (RECEIVED_HANDLE)0x0) {
    *received_handle = (RECEIVED_HANDLE)0x0;
    iVar3 = 0x4353;
  }
  else {
    pRVar4->composite_value = (AMQP_VALUE)0x0;
    *received_handle = pRVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      received_destroy(*received_handle);
      iVar3 = 0x435b;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_34);
      iVar3 = 0x4362;
      if (iVar1 == 0) {
        if (local_34 == 0) {
          iVar3 = 0x438f;
        }
        else {
          value_00 = amqpvalue_get_list_item(pAVar5,0);
          if (value_00 == (AMQP_VALUE)0x0) {
            received_destroy(*received_handle);
            iVar3 = 0x4371;
          }
          else {
            AVar2 = amqpvalue_get_type(value_00);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(value_00);
              received_destroy(*received_handle);
              iVar3 = 0x437b;
            }
            else {
              iVar3 = amqpvalue_get_uint(value_00,(uint32_t *)&local_30);
              if (iVar3 == 0) {
                amqpvalue_destroy(value_00);
                iVar3 = 0x43b8;
                if (1 < local_34) {
                  pAVar5 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar5 == (AMQP_VALUE)0x0) {
                    received_destroy(*received_handle);
                    iVar3 = 0x439a;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAVar5);
                      received_destroy(*received_handle);
                      iVar3 = 0x43a4;
                    }
                    else {
                      iVar3 = amqpvalue_get_ulong(pAVar5,&local_30);
                      if (iVar3 == 0) {
                        amqpvalue_destroy(pAVar5);
                        pAVar5 = amqpvalue_clone(value);
                        pRVar4->composite_value = pAVar5;
                        iVar3 = 0;
                      }
                      else {
                        amqpvalue_destroy(pAVar5);
                        received_destroy(*received_handle);
                        iVar3 = 0x43ae;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(value_00);
                received_destroy(*received_handle);
                iVar3 = 0x4385;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_received(AMQP_VALUE value, RECEIVED_HANDLE* received_handle)
{
    int result;
    RECEIVED_INSTANCE* received_instance = (RECEIVED_INSTANCE*)received_create_internal();
    *received_handle = received_instance;
    if (*received_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            received_destroy(*received_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* section-number */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t section_number;
                                if (amqpvalue_get_uint(item_value, &section_number) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    received_destroy(*received_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* section-offset */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                received_destroy(*received_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint64_t section_offset;
                                if (amqpvalue_get_ulong(item_value, &section_offset) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    received_destroy(*received_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    received_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}